

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O0

HdlcAnalyzerResults * __thiscall
HdlcAnalyzerResults::EscapeByteStr_abi_cxx11_(HdlcAnalyzerResults *this,Frame *frame)

{
  long in_RDX;
  allocator local_35 [20];
  allocator local_21 [9];
  Frame *frame_local;
  HdlcAnalyzerResults *this_local;
  
  frame_local = frame;
  this_local = this;
  if ((*(int *)(*(long *)(frame + 0x10) + 0x24) == 1) && ((*(byte *)(in_RDX + 0x21) & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"0x7D-",local_21);
    std::allocator<char>::~allocator((allocator<char> *)local_21);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",local_35);
    std::allocator<char>::~allocator((allocator<char> *)local_35);
  }
  return this;
}

Assistant:

string HdlcAnalyzerResults::EscapeByteStr( const Frame& frame )
{
    if( ( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BYTE_ASYNC ) && ( frame.mFlags & HDLC_ESCAPED_BYTE ) )
    {
        return string( "0x7D-" );
    }
    else
    {
        return string( "" );
    }
}